

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d60_q0_zipcode.cpp
# Opt level: O2

int main(void)

{
  pointer pLVar1;
  istream *piVar2;
  ostream *poVar3;
  pointer pLVar4;
  int iVar5;
  int n;
  int nzip;
  vector<Letter,_std::allocator<Letter>_> letters;
  ZipInfo z;
  vector<ZipInfo,_std::allocator<ZipInfo>_> zipinfo;
  int local_f0;
  int local_ec;
  vector<Letter,_std::allocator<Letter>_> local_e8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  undefined1 local_c0 [16];
  string local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [16];
  string local_90 [8];
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  int local_50 [2];
  vector<ZipInfo,_std::allocator<ZipInfo>_> local_48;
  
  std::istream::operator>>((istream *)&std::cin,&local_ec);
  local_48.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (iVar5 = 0; iVar5 < local_ec; iVar5 = iVar5 + 1) {
    local_c8._M_p = local_c0 + 8;
    local_c0._0_8_ = 0;
    local_c0[8] = '\0';
    local_a0._0_8_ = 0;
    local_a0[8] = '\0';
    local_a8._M_p = local_a0 + 8;
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)local_d0);
    piVar2 = std::operator>>(piVar2,(string *)&local_a8);
    std::operator>>(piVar2,(string *)&local_c8);
    std::vector<ZipInfo,_std::allocator<ZipInfo>_>::push_back(&local_48,(ZipInfo *)local_d0);
    ZipInfo::~ZipInfo((ZipInfo *)local_d0);
  }
  std::istream::operator>>((istream *)&std::cin,&local_f0);
  local_e8.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (iVar5 = 0; iVar5 < local_f0; iVar5 = iVar5 + 1) {
    local_d0 = (undefined1  [8])local_c0;
    local_c8._M_p = (pointer)0x0;
    local_c0._0_8_ = local_c0._0_8_ & 0xffffffffffffff00;
    local_b0 = (string  [8])local_a0;
    local_a8._M_p = (pointer)0x0;
    local_a0._0_8_ = local_a0._0_8_ & 0xffffffffffffff00;
    local_90 = (string  [8])&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    piVar2 = std::operator>>((istream *)&std::cin,(string *)local_d0);
    piVar2 = std::operator>>(piVar2,local_b0);
    piVar2 = std::operator>>(piVar2,(string *)&local_70);
    piVar2 = std::operator>>(piVar2,local_90);
    std::istream::operator>>(piVar2,local_50);
    std::vector<Letter,_std::allocator<Letter>_>::push_back(&local_e8,(Letter *)local_d0);
    Letter::~Letter((Letter *)local_d0);
  }
  correctZipAndSortLetters(&local_48,&local_e8);
  pLVar1 = local_e8.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pLVar4 = local_e8.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar4 != pLVar1; pLVar4 = pLVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pLVar4);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&pLVar4->address);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&pLVar4->district);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&pLVar4->province);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pLVar4->zip);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::vector<Letter,_std::allocator<Letter>_>::~vector(&local_e8);
  std::vector<ZipInfo,_std::allocator<ZipInfo>_>::~vector(&local_48);
  return 0;
}

Assistant:

int main() {
    int nzip;
    cin >> nzip;
    vector<ZipInfo> zipinfo;
    for (int i = 0; i < nzip; i++) {
        ZipInfo z;
        cin >> z.zip >> z.district >> z.province;
        zipinfo.push_back(z);
    }
    int n;
    cin >> n;
    vector<Letter> letters;
    for (int i = 0; i < n; i++) {
        Letter l;
        cin >> l.name >> l.address >> l.district >> l.province >> l.zip;
        letters.push_back(l);
    }
    correctZipAndSortLetters(zipinfo, letters);
    for (auto &l : letters) {
        cout << l.name << " " << l.address << " " << l.district << " "
             << l.province << " " << l.zip << endl;
    }
}